

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

RealType __thiscall
OpenMD::EAM::Zhou2004Functional
          (EAM *this,RealType rho,RealType rhoe,RealType rhos,
          vector<double,_std::allocator<double>_> *Fn,vector<double,_std::allocator<double>_> *F,
          RealType Fe,RealType eta,RealType rhol,RealType rhoh)

{
  double dVar1;
  reference pvVar2;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  RealType t;
  RealType functional;
  RealType rho0;
  RealType rhon;
  size_type in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff10;
  undefined8 local_68;
  
  dVar3 = in_XMM5_Qa * in_XMM1_Qa;
  local_68 = 0.0;
  if (dVar3 <= in_XMM0_Qa) {
    if ((in_XMM0_Qa < dVar3) || (in_XMM6_Qa * in_XMM1_Qa <= in_XMM0_Qa)) {
      if (in_XMM6_Qa * in_XMM1_Qa <= in_XMM0_Qa) {
        dVar3 = pow(in_XMM0_Qa / in_XMM2_Qa,in_XMM4_Qa);
        dVar3 = log(dVar3);
        local_68 = pow(in_XMM0_Qa / in_XMM2_Qa,in_XMM4_Qa);
        local_68 = in_XMM3_Qa * (1.0 - dVar3) * local_68;
      }
    }
    else {
      dVar4 = in_XMM0_Qa / in_XMM1_Qa - 1.0;
      pvVar2 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_68 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      dVar3 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      dVar1 = *pvVar2;
      pvVar2 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_68 = dVar4 * (dVar4 * (dVar4 * *pvVar2 + dVar1) + dVar3) + local_68;
    }
  }
  else {
    dVar4 = in_XMM0_Qa / dVar3 - 1.0;
    pvVar2 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_68 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    dVar3 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    dVar1 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_68 = dVar4 * (dVar4 * (dVar4 * *pvVar2 + dVar1) + dVar3) + local_68;
  }
  return local_68;
}

Assistant:

RealType EAM::Zhou2004Functional(RealType rho, RealType rhoe, RealType rhos,
                                   std::vector<RealType> Fn,
                                   std::vector<RealType> F, RealType Fe,
                                   RealType eta, RealType rhol, RealType rhoh) {
    RealType rhon = rhol * rhoe;
    RealType rho0 = rhoh * rhoe;
    RealType functional(0.0);
    RealType t;
    if (rho < rhon) {
      t          = rho / rhon - 1.0;
      functional = Fn.at(0) + t * (Fn.at(1) + t * (Fn.at(2) + t * Fn.at(3)));
    } else if (rhon <= rho && rho < rho0) {
      t          = rho / rhoe - 1.0;
      functional = F.at(0) + t * (F.at(1) + t * (F.at(2) + t * F.at(3)));
    } else if (rho0 <= rho) {
      t          = rho / rhos;
      functional = Fe * (1.0 - log(pow(t, eta))) * pow(t, eta);
    }
    return functional;
  }